

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void xla::Reorder(Rep *r)

{
  value_type vVar1;
  size_type sVar2;
  size_type sVar3;
  iterator __first1;
  iterator __last1;
  iterator __first2;
  iterator __last2;
  iterator __result;
  reference pvVar4;
  reference pvVar5;
  ulong local_48;
  size_t i;
  Rep *r_local;
  
  Sort(&r->nodes_,&r->deltab_);
  Sort(&r->nodes_,&r->deltaf_);
  std::vector<int,_std::allocator<int>_>::clear(&r->list_);
  MoveToList(r,&r->deltab_,&r->list_);
  MoveToList(r,&r->deltaf_,&r->list_);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&r->deltab_);
  sVar3 = std::vector<int,_std::allocator<int>_>::size(&r->deltaf_);
  std::vector<int,_std::allocator<int>_>::resize(&r->merged_,sVar2 + sVar3);
  __first1 = std::vector<int,_std::allocator<int>_>::begin(&r->deltab_);
  __last1 = std::vector<int,_std::allocator<int>_>::end(&r->deltab_);
  __first2 = std::vector<int,_std::allocator<int>_>::begin(&r->deltaf_);
  __last2 = std::vector<int,_std::allocator<int>_>::end(&r->deltaf_);
  __result = std::vector<int,_std::allocator<int>_>::begin(&r->merged_);
  std::
  merge<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last1._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__last2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__result._M_current)
  ;
  local_48 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size(&r->list_);
    if (sVar2 <= local_48) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&r->merged_,local_48);
    vVar1 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&r->list_,local_48);
    pvVar5 = std::
             vector<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
             ::operator[](&r->nodes_,(long)*pvVar4);
    pvVar5->rank = vVar1;
    local_48 = local_48 + 1;
  }
  return;
}

Assistant:

static void Reorder(GraphCycles::Rep* r) {
  Sort(r->nodes_, &r->deltab_);
  Sort(r->nodes_, &r->deltaf_);

  // Adds contents of delta lists to list_ (backwards deltas first).
  r->list_.clear();
  MoveToList(r, &r->deltab_, &r->list_);
  MoveToList(r, &r->deltaf_, &r->list_);

  // Produce sorted list of all ranks that will be reassigned.
  r->merged_.resize(r->deltab_.size() + r->deltaf_.size());
  std::merge(r->deltab_.begin(), r->deltab_.end(), r->deltaf_.begin(),
             r->deltaf_.end(), r->merged_.begin());

  // Assign the ranks in order to the collected list.
  for (size_t i = 0; i < r->list_.size(); i++) {
    r->nodes_[r->list_[i]].rank = r->merged_[i];
  }
}